

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void helper_store_dbatu_ppc64(CPUPPCState_conflict2 *env,uint32_t nr,target_ulong value)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  target_ulong *ptVar1;
  ulong uVar2;
  uint uVar3;
  target_ulong tVar5;
  CPUPPCState_conflict2 *__mptr;
  long lVar6;
  ulong uVar4;
  
  uVar2 = env->DBAT[0][nr];
  if (uVar2 != value) {
    uVar3 = ((uint)value & 0x1ffc) << 0xf;
    uVar4 = (ulong)uVar3;
    cpu = &env[-1].spr_cb[0x1bf].oea_write;
    if (uVar3 < 0x3e1000) {
      tVar5 = uVar2 & 0xfffffffffffe0000;
      lVar6 = uVar4 + 0x20000;
      do {
        tlb_flush_page_ppc64((CPUState *)cpu,tVar5);
        tVar5 = tVar5 + 0x1000;
        lVar6 = lVar6 + -0x1000;
      } while (lVar6 != 0);
    }
    else {
      tlb_flush_ppc64((CPUState *)cpu);
    }
    ptVar1 = env->DBAT[1] + nr;
    *ptVar1 = *ptVar1 & (uVar4 ^ 0xfffffffffffe007b);
    tVar5 = ~uVar4 & value & 0xfffffffffffe0000;
    env->DBAT[0][nr] = (uint)value & 0x1fff | tVar5;
    if (0x3e0fff < uVar4) {
      tlb_flush_ppc64((CPUState *)cpu);
      return;
    }
    lVar6 = uVar4 + 0x20000;
    do {
      tlb_flush_page_ppc64((CPUState *)cpu,tVar5);
      tVar5 = tVar5 + 0x1000;
      lVar6 = lVar6 + -0x1000;
    } while (lVar6 != 0);
  }
  return;
}

Assistant:

void helper_store_dbatu(CPUPPCState *env, uint32_t nr, target_ulong value)
{
    target_ulong mask;
#if defined(FLUSH_ALL_TLBS)
    PowerPCCPU *cpu = env_archcpu(env);
#endif

    dump_store_bat(env, 'D', 0, nr, value);
    if (env->DBAT[0][nr] != value) {
        /*
         * When storing valid upper BAT, mask BEPI and BRPN and
         * invalidate all TLBs covered by this BAT
         */
        mask = (value << 15) & 0x0FFE0000UL;
#if !defined(FLUSH_ALL_TLBS)
        do_invalidate_BAT(env, env->DBAT[0][nr], mask);
#endif
        mask = (value << 15) & 0x0FFE0000UL;
        env->DBAT[0][nr] = (value & 0x00001FFFUL) |
            (value & ~0x0001FFFFUL & ~mask);
        env->DBAT[1][nr] = (env->DBAT[1][nr] & 0x0000007B) |
            (env->DBAT[1][nr] & ~0x0001FFFF & ~mask);
#if !defined(FLUSH_ALL_TLBS)
        do_invalidate_BAT(env, env->DBAT[0][nr], mask);
#else
        tlb_flush(env_cpu(env));
#endif
    }
}